

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply_encoder.cc
# Opt level: O3

bool __thiscall draco::PlyEncoder::EncodeInternal(PlyEncoder *this)

{
  int iVar1;
  uint uVar2;
  EncoderBuffer *pEVar3;
  __uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_> _Var4;
  pointer paVar5;
  char cVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  ostream *poVar10;
  size_t sVar11;
  Mesh *pMVar12;
  uint uVar13;
  uint uVar14;
  long lVar15;
  long lVar16;
  bool bVar17;
  ulong uVar18;
  uint *puVar19;
  char *pcVar20;
  _Head_base<0UL,_draco::PointAttribute_*,_false> _Var21;
  ulong uVar22;
  long lVar23;
  string header_str;
  stringstream out;
  undefined1 local_1f1;
  uint local_1f0;
  uint local_1ec;
  ulong local_1e8;
  _Head_base<0UL,_draco::PointAttribute_*,_false> local_1e0;
  long *local_1d8;
  long local_1d0;
  long local_1c8 [2];
  stringstream local_1b8 [16];
  long local_1a8 [14];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"ply",3);
  cVar6 = (char)(ostream *)local_1a8;
  std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar6);
  std::ostream::put(cVar6);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"format binary_little_endian 1.0",0x1f);
  std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar6);
  std::ostream::put(cVar6);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"element vertex ",0xf);
  poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
  std::ostream::put((char)poVar10);
  std::ostream::flush();
  uVar8 = PointCloud::GetNamedAttributeId(this->in_point_cloud_,POSITION);
  uVar9 = PointCloud::GetNamedAttributeId(this->in_point_cloud_,NORMAL);
  local_1f0 = PointCloud::GetNamedAttributeId(this->in_point_cloud_,TEX_COORD);
  local_1ec = PointCloud::GetNamedAttributeId(this->in_point_cloud_,COLOR);
  if ((int)uVar8 < 0) {
    bVar17 = false;
    goto LAB_0011d7a3;
  }
  if ((-1 < (int)uVar9) &&
     (*(char *)((long)(this->in_point_cloud_->attributes_).
                      super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar9]._M_t.
                      super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
                      ._M_t + 0x18) != '\x03')) {
    uVar9 = 0xffffffff;
  }
  if ((-1 < (int)local_1f0) &&
     (*(char *)((long)(this->in_point_cloud_->attributes_).
                      super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[local_1f0]._M_t.
                      super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
                      ._M_t + 0x18) != '\x02')) {
    local_1f0 = 0xffffffff;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"property ",9);
  iVar1 = *(int *)((long)(this->in_point_cloud_->attributes_).
                         super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar8]._M_t.
                         super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
                         ._M_t + 0x1c);
  iVar7 = (int)(ostream *)local_1a8;
  if (iVar1 == 9) {
    pcVar20 = "float";
LAB_0011cbc3:
    sVar11 = strlen(pcVar20);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar20,sVar11);
  }
  else {
    if (iVar1 == 5) {
      pcVar20 = "int";
      goto LAB_0011cbc3;
    }
    if (iVar1 == 2) {
      pcVar20 = "uchar";
      goto LAB_0011cbc3;
    }
    std::ios::clear(iVar7 + (int)*(undefined8 *)(local_1a8[0] + -0x18));
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," x",2);
  std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar6);
  std::ostream::put(cVar6);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"property ",9);
  iVar1 = *(int *)((long)(this->in_point_cloud_->attributes_).
                         super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar8]._M_t.
                         super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
                         ._M_t + 0x1c);
  if (iVar1 == 9) {
    pcVar20 = "float";
LAB_0011cc7c:
    sVar11 = strlen(pcVar20);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar20,sVar11);
  }
  else {
    if (iVar1 == 5) {
      pcVar20 = "int";
      goto LAB_0011cc7c;
    }
    if (iVar1 == 2) {
      pcVar20 = "uchar";
      goto LAB_0011cc7c;
    }
    std::ios::clear(iVar7 + (int)*(undefined8 *)(local_1a8[0] + -0x18));
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," y",2);
  std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar6);
  std::ostream::put(cVar6);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"property ",9);
  iVar1 = *(int *)((long)(this->in_point_cloud_->attributes_).
                         super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar8]._M_t.
                         super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
                         ._M_t + 0x1c);
  if (iVar1 == 9) {
    pcVar20 = "float";
LAB_0011cd35:
    sVar11 = strlen(pcVar20);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar20,sVar11);
  }
  else {
    if (iVar1 == 5) {
      pcVar20 = "int";
      goto LAB_0011cd35;
    }
    if (iVar1 == 2) {
      pcVar20 = "uchar";
      goto LAB_0011cd35;
    }
    std::ios::clear(iVar7 + (int)*(undefined8 *)(local_1a8[0] + -0x18));
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," z",2);
  std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar6);
  std::ostream::put(cVar6);
  std::ostream::flush();
  local_1e8 = (ulong)uVar9;
  if (-1 < (int)uVar9) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"property ",9);
    iVar1 = *(int *)((long)(this->in_point_cloud_->attributes_).
                           super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[local_1e8]._M_t.
                           super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
                           ._M_t + 0x1c);
    if (iVar1 == 9) {
      pcVar20 = "float";
LAB_0011ce04:
      sVar11 = strlen(pcVar20);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar20,sVar11);
    }
    else {
      if (iVar1 == 5) {
        pcVar20 = "int";
        goto LAB_0011ce04;
      }
      if (iVar1 == 2) {
        pcVar20 = "uchar";
        goto LAB_0011ce04;
      }
      std::ios::clear(iVar7 + (int)*(undefined8 *)(local_1a8[0] + -0x18));
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," nx",3);
    std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar6);
    std::ostream::put(cVar6);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"property ",9);
    iVar1 = *(int *)((long)(this->in_point_cloud_->attributes_).
                           super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[local_1e8]._M_t.
                           super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
                           ._M_t + 0x1c);
    if (iVar1 == 9) {
      pcVar20 = "float";
LAB_0011cec2:
      sVar11 = strlen(pcVar20);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar20,sVar11);
    }
    else {
      if (iVar1 == 5) {
        pcVar20 = "int";
        goto LAB_0011cec2;
      }
      if (iVar1 == 2) {
        pcVar20 = "uchar";
        goto LAB_0011cec2;
      }
      std::ios::clear(iVar7 + (int)*(undefined8 *)(local_1a8[0] + -0x18));
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ny",3);
    std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar6);
    std::ostream::put(cVar6);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"property ",9);
    iVar1 = *(int *)((long)(this->in_point_cloud_->attributes_).
                           super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[local_1e8]._M_t.
                           super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
                           ._M_t + 0x1c);
    if (iVar1 == 9) {
      pcVar20 = "float";
LAB_0011cf80:
      sVar11 = strlen(pcVar20);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar20,sVar11);
    }
    else {
      if (iVar1 == 5) {
        pcVar20 = "int";
        goto LAB_0011cf80;
      }
      if (iVar1 == 2) {
        pcVar20 = "uchar";
        goto LAB_0011cf80;
      }
      std::ios::clear(iVar7 + (int)*(undefined8 *)(local_1a8[0] + -0x18));
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," nz",3);
    std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar6);
    std::ostream::put(cVar6);
    std::ostream::flush();
  }
  uVar22 = (ulong)local_1ec;
  if ((-1 < (int)local_1ec) &&
     (_Var21._M_head_impl =
           *(PointAttribute **)
            &(this->in_point_cloud_->attributes_).
             super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar22]._M_t.
             super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
             ._M_t, *(char *)((long)_Var21._M_head_impl + 0x18) != '\0')) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"property ",9);
    iVar1 = *(int *)((long)(this->in_point_cloud_->attributes_).
                           super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar22]._M_t.
                           super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
                           ._M_t + 0x1c);
    local_1e0._M_head_impl = _Var21._M_head_impl;
    if (iVar1 == 9) {
      pcVar20 = "float";
LAB_0011d064:
      sVar11 = strlen(pcVar20);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar20,sVar11);
      _Var21._M_head_impl = local_1e0._M_head_impl;
    }
    else {
      if (iVar1 == 5) {
        pcVar20 = "int";
        goto LAB_0011d064;
      }
      if (iVar1 == 2) {
        pcVar20 = "uchar";
        goto LAB_0011d064;
      }
      std::ios::clear(iVar7 + (int)*(undefined8 *)(local_1a8[0] + -0x18));
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," red",4);
    std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar6);
    std::ostream::put(cVar6);
    std::ostream::flush();
    if (1 < *(uint8_t *)((long)&(_Var21._M_head_impl)->super_GeometryAttribute + 0x18)) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"property ",9);
      iVar1 = *(int *)((long)(this->in_point_cloud_->attributes_).
                             super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar22]._M_t.
                             super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
                             ._M_t + 0x1c);
      if (iVar1 == 9) {
        pcVar20 = "float";
LAB_0011d12d:
        sVar11 = strlen(pcVar20);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar20,sVar11);
        _Var21._M_head_impl = local_1e0._M_head_impl;
      }
      else {
        if (iVar1 == 5) {
          pcVar20 = "int";
          goto LAB_0011d12d;
        }
        if (iVar1 == 2) {
          pcVar20 = "uchar";
          goto LAB_0011d12d;
        }
        std::ios::clear(iVar7 + (int)*(undefined8 *)(local_1a8[0] + -0x18));
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," green",6);
      std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar6);
      std::ostream::put(cVar6);
      std::ostream::flush();
      if (2 < *(byte *)((long)_Var21._M_head_impl + 0x18)) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"property ",9);
        iVar1 = *(int *)((long)(this->in_point_cloud_->attributes_).
                               super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[uVar22]._M_t.
                               super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
                               ._M_t + 0x1c);
        if (iVar1 == 9) {
          pcVar20 = "float";
LAB_0011d1f6:
          sVar11 = strlen(pcVar20);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar20,sVar11);
          _Var21._M_head_impl = local_1e0._M_head_impl;
        }
        else {
          if (iVar1 == 5) {
            pcVar20 = "int";
            goto LAB_0011d1f6;
          }
          if (iVar1 == 2) {
            pcVar20 = "uchar";
            goto LAB_0011d1f6;
          }
          std::ios::clear(iVar7 + (int)*(undefined8 *)(local_1a8[0] + -0x18));
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," blue",5);
        std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar6);
        std::ostream::put(cVar6);
        std::ostream::flush();
        if (3 < *(uint8_t *)((long)&(_Var21._M_head_impl)->super_GeometryAttribute + 0x18)) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"property ",9);
          iVar1 = *(int *)((long)(this->in_point_cloud_->attributes_).
                                 super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[uVar22]._M_t.
                                 super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
                                 ._M_t + 0x1c);
          if (iVar1 == 9) {
            pcVar20 = "float";
LAB_0011d2bf:
            sVar11 = strlen(pcVar20);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar20,sVar11);
          }
          else {
            if (iVar1 == 5) {
              pcVar20 = "int";
              goto LAB_0011d2bf;
            }
            if (iVar1 == 2) {
              pcVar20 = "uchar";
              goto LAB_0011d2bf;
            }
            std::ios::clear(iVar7 + (int)*(undefined8 *)(local_1a8[0] + -0x18));
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," alpha",6);
          std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar6);
          std::ostream::put(cVar6);
          std::ostream::flush();
        }
      }
    }
  }
  if (this->in_mesh_ != (Mesh *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"element face ",0xd);
    poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"property list uchar int vertex_indices",0x26);
    std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar6);
    std::ostream::put(cVar6);
    std::ostream::flush();
    if (-1 < (int)local_1f0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"property list uchar ",0x14);
      iVar1 = *(int *)((long)(this->in_point_cloud_->attributes_).
                             super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[local_1f0]._M_t.
                             super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
                             ._M_t + 0x1c);
      if (iVar1 == 9) {
        pcVar20 = "float";
LAB_0011d431:
        sVar11 = strlen(pcVar20);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar20,sVar11);
      }
      else {
        if (iVar1 == 5) {
          pcVar20 = "int";
          goto LAB_0011d431;
        }
        if (iVar1 == 2) {
          pcVar20 = "uchar";
          goto LAB_0011d431;
        }
        std::ios::clear(iVar7 + (int)*(undefined8 *)(local_1a8[0] + -0x18));
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," texcoord",9);
      std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar6);
      std::ostream::put(cVar6);
      std::ostream::flush();
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"end_header",10);
  std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar6);
  std::ostream::put(cVar6);
  std::ostream::flush();
  std::__cxx11::stringbuf::str();
  pEVar3 = this->out_buffer_;
  if (pEVar3->bit_encoder_reserved_bytes_ < 1) {
    std::vector<char,std::allocator<char>>::_M_range_insert<unsigned_char_const*>
              ((vector<char,std::allocator<char>> *)pEVar3,
               (pEVar3->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish,local_1d8,local_1d0 + (long)local_1d8);
  }
  uVar2 = this->in_point_cloud_->num_points_;
  if ((ulong)uVar2 != 0) {
    uVar18 = 0;
    do {
      _Var4._M_t.
      super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>.
      super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl =
           (this->in_point_cloud_->attributes_).
           super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[uVar8]._M_t.
           super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
           ._M_t;
      uVar14 = (uint)uVar18;
      uVar13 = uVar14;
      if (*(char *)((long)_Var4._M_t.
                          super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                          .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl + 100)
          != '\x01') {
        uVar13 = *(uint *)(*(long *)((long)_Var4._M_t.
                                           super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                                           .super__Head_base<0UL,_draco::PointAttribute_*,_false>.
                                           _M_head_impl + 0x48) + uVar18 * 4);
      }
      pEVar3 = this->out_buffer_;
      if (pEVar3->bit_encoder_reserved_bytes_ < 1) {
        lVar15 = (ulong)uVar13 *
                 *(long *)((long)_Var4._M_t.
                                 super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                                 .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl
                          + 0x28) +
                 **(long **)_Var4._M_t.
                            super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                            .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl +
                 *(long *)((long)_Var4._M_t.
                                 super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                                 .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl
                          + 0x30);
        std::vector<char,std::allocator<char>>::_M_range_insert<unsigned_char_const*>
                  ((vector<char,std::allocator<char>> *)pEVar3,
                   (pEVar3->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_finish,lVar15,
                   *(long *)((long)_Var4._M_t.
                                   super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                                   .super__Head_base<0UL,_draco::PointAttribute_*,_false>.
                                   _M_head_impl + 0x28) + lVar15);
      }
      if (-1 < (int)uVar9) {
        _Var4._M_t.
        super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
        .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl =
             (this->in_point_cloud_->attributes_).
             super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[local_1e8]._M_t.
             super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
             ._M_t;
        uVar13 = uVar14;
        if (*(char *)((long)_Var4._M_t.
                            super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                            .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl +
                     100) != '\x01') {
          uVar13 = *(uint *)(*(long *)((long)_Var4._M_t.
                                             super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                                             .super__Head_base<0UL,_draco::PointAttribute_*,_false>.
                                             _M_head_impl + 0x48) + uVar18 * 4);
        }
        pEVar3 = this->out_buffer_;
        if (pEVar3->bit_encoder_reserved_bytes_ < 1) {
          lVar15 = (ulong)uVar13 *
                   *(long *)((long)_Var4._M_t.
                                   super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                                   .super__Head_base<0UL,_draco::PointAttribute_*,_false>.
                                   _M_head_impl + 0x28) +
                   **(long **)_Var4._M_t.
                              super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                              .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl +
                   *(long *)((long)_Var4._M_t.
                                   super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                                   .super__Head_base<0UL,_draco::PointAttribute_*,_false>.
                                   _M_head_impl + 0x30);
          std::vector<char,std::allocator<char>>::_M_range_insert<unsigned_char_const*>
                    ((vector<char,std::allocator<char>> *)pEVar3,
                     (pEVar3->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_finish,lVar15,
                     *(long *)((long)_Var4._M_t.
                                     super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                                     .super__Head_base<0UL,_draco::PointAttribute_*,_false>.
                                     _M_head_impl + 0x28) + lVar15);
        }
      }
      if (-1 < (int)local_1ec) {
        _Var4._M_t.
        super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
        .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl =
             (this->in_point_cloud_->attributes_).
             super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar22]._M_t.
             super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
             ._M_t;
        if (*(char *)((long)_Var4._M_t.
                            super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                            .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl +
                     100) != '\x01') {
          uVar14 = *(uint *)(*(long *)((long)_Var4._M_t.
                                             super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                                             .super__Head_base<0UL,_draco::PointAttribute_*,_false>.
                                             _M_head_impl + 0x48) + uVar18 * 4);
        }
        pEVar3 = this->out_buffer_;
        if (pEVar3->bit_encoder_reserved_bytes_ < 1) {
          lVar15 = (ulong)uVar14 *
                   *(long *)((long)_Var4._M_t.
                                   super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                                   .super__Head_base<0UL,_draco::PointAttribute_*,_false>.
                                   _M_head_impl + 0x28) +
                   **(long **)_Var4._M_t.
                              super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                              .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl +
                   *(long *)((long)_Var4._M_t.
                                   super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                                   .super__Head_base<0UL,_draco::PointAttribute_*,_false>.
                                   _M_head_impl + 0x30);
          std::vector<char,std::allocator<char>>::_M_range_insert<unsigned_char_const*>
                    ((vector<char,std::allocator<char>> *)pEVar3,
                     (pEVar3->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_finish,lVar15,
                     *(long *)((long)_Var4._M_t.
                                     super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                                     .super__Head_base<0UL,_draco::PointAttribute_*,_false>.
                                     _M_head_impl + 0x28) + lVar15);
        }
      }
      uVar18 = uVar18 + 1;
    } while (uVar2 != uVar18);
  }
  pMVar12 = this->in_mesh_;
  bVar17 = true;
  if ((pMVar12 != (Mesh *)0x0) &&
     ((int)((ulong)((long)(pMVar12->faces_).vector_.
                          super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(pMVar12->faces_).vector_.
                         super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 2) * -0x55555555 != 0)) {
    local_1e8 = (ulong)local_1f0;
    lVar15 = 0;
    uVar8 = 0;
    do {
      pEVar3 = this->out_buffer_;
      local_1f1 = 3;
      if (pEVar3->bit_encoder_reserved_bytes_ < 1) {
        std::vector<char,std::allocator<char>>::_M_range_insert<unsigned_char_const*>
                  ((vector<char,std::allocator<char>> *)pEVar3,
                   (pEVar3->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_1f1,&local_1f0);
        pMVar12 = this->in_mesh_;
      }
      paVar5 = (pMVar12->faces_).vector_.
               super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar19 = (uint *)((long)&paVar5->_M_elems[0].value_ + lVar15);
      lVar23 = 3;
      local_1ec = uVar8;
      do {
        if (uVar2 <= *puVar19) {
          bVar17 = false;
          goto LAB_0011d788;
        }
        pEVar3 = this->out_buffer_;
        if (pEVar3->bit_encoder_reserved_bytes_ < 1) {
          std::vector<char,std::allocator<char>>::_M_range_insert<unsigned_char_const*>
                    ((vector<char,std::allocator<char>> *)pEVar3,
                     (pEVar3->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_finish,puVar19,puVar19 + 1);
        }
        puVar19 = puVar19 + 1;
        lVar23 = lVar23 + -1;
      } while (lVar23 != 0);
      if (-1 < (int)local_1f0) {
        pEVar3 = this->out_buffer_;
        local_1f1 = 6;
        if (pEVar3->bit_encoder_reserved_bytes_ < 1) {
          std::vector<char,std::allocator<char>>::_M_range_insert<unsigned_char_const*>
                    ((vector<char,std::allocator<char>> *)pEVar3,
                     (pEVar3->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_finish,&local_1f1,&local_1f0);
        }
        _Var4._M_t.
        super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
        .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl =
             (this->in_point_cloud_->attributes_).
             super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[local_1e8]._M_t.
             super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
             ._M_t;
        lVar23 = 0;
        do {
          uVar8 = *(uint *)((long)(paVar5->_M_elems + lVar23) + lVar15);
          if (*(char *)((long)_Var4._M_t.
                              super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                              .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl +
                       100) == '\0') {
            uVar8 = *(uint *)(*(long *)((long)_Var4._M_t.
                                              super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                                              .super__Head_base<0UL,_draco::PointAttribute_*,_false>
                                              ._M_head_impl + 0x48) + (ulong)uVar8 * 4);
          }
          pEVar3 = this->out_buffer_;
          if (pEVar3->bit_encoder_reserved_bytes_ < 1) {
            lVar16 = (ulong)uVar8 *
                     *(long *)((long)_Var4._M_t.
                                     super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                                     .super__Head_base<0UL,_draco::PointAttribute_*,_false>.
                                     _M_head_impl + 0x28) +
                     **(long **)_Var4._M_t.
                                super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                                .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl
                     + *(long *)((long)_Var4._M_t.
                                       super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                                       .super__Head_base<0UL,_draco::PointAttribute_*,_false>.
                                       _M_head_impl + 0x30);
            std::vector<char,std::allocator<char>>::_M_range_insert<unsigned_char_const*>
                      ((vector<char,std::allocator<char>> *)pEVar3,
                       (pEVar3->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_finish,lVar16,
                       *(long *)((long)_Var4._M_t.
                                       super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                                       .super__Head_base<0UL,_draco::PointAttribute_*,_false>.
                                       _M_head_impl + 0x28) + lVar16);
          }
          lVar23 = lVar23 + 1;
        } while (lVar23 != 3);
      }
      uVar8 = local_1ec + 1;
      pMVar12 = this->in_mesh_;
      lVar15 = lVar15 + 0xc;
    } while (uVar8 < (uint)((int)((ulong)((long)(pMVar12->faces_).vector_.
                                                super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)(pMVar12->faces_).vector_.
                                               super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start) >> 2) *
                           -0x55555555));
    bVar17 = true;
  }
LAB_0011d788:
  if (local_1d8 != local_1c8) {
    operator_delete(local_1d8,local_1c8[0] + 1);
  }
LAB_0011d7a3:
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return bVar17;
}

Assistant:

bool PlyEncoder::EncodeInternal() {
  // Write PLY header.
  // TODO(ostava): Currently works only for xyz positions and rgb(a) colors.
  std::stringstream out;
  out << "ply" << std::endl;
  out << "format binary_little_endian 1.0" << std::endl;
  out << "element vertex " << in_point_cloud_->num_points() << std::endl;

  const int pos_att_id =
      in_point_cloud_->GetNamedAttributeId(GeometryAttribute::POSITION);
  int normal_att_id =
      in_point_cloud_->GetNamedAttributeId(GeometryAttribute::NORMAL);
  int tex_coord_att_id =
      in_point_cloud_->GetNamedAttributeId(GeometryAttribute::TEX_COORD);
  const int color_att_id =
      in_point_cloud_->GetNamedAttributeId(GeometryAttribute::COLOR);

  if (pos_att_id < 0) {
    return false;
  }

  // Ensure normals are 3 component. Don't encode them otherwise.
  if (normal_att_id >= 0 &&
      in_point_cloud_->attribute(normal_att_id)->num_components() != 3) {
    normal_att_id = -1;
  }

  // Ensure texture coordinates have only 2 components. Don't encode them
  // otherwise. TODO(ostava): Add support for 3 component normals (uvw).
  if (tex_coord_att_id >= 0 &&
      in_point_cloud_->attribute(tex_coord_att_id)->num_components() != 2) {
    tex_coord_att_id = -1;
  }

  out << "property " << GetAttributeDataType(pos_att_id) << " x" << std::endl;
  out << "property " << GetAttributeDataType(pos_att_id) << " y" << std::endl;
  out << "property " << GetAttributeDataType(pos_att_id) << " z" << std::endl;
  if (normal_att_id >= 0) {
    out << "property " << GetAttributeDataType(normal_att_id) << " nx"
        << std::endl;
    out << "property " << GetAttributeDataType(normal_att_id) << " ny"
        << std::endl;
    out << "property " << GetAttributeDataType(normal_att_id) << " nz"
        << std::endl;
  }
  if (color_att_id >= 0) {
    const auto *const attribute = in_point_cloud_->attribute(color_att_id);
    if (attribute->num_components() > 0) {
      out << "property " << GetAttributeDataType(color_att_id) << " red"
          << std::endl;
    }
    if (attribute->num_components() > 1) {
      out << "property " << GetAttributeDataType(color_att_id) << " green"
          << std::endl;
    }
    if (attribute->num_components() > 2) {
      out << "property " << GetAttributeDataType(color_att_id) << " blue"
          << std::endl;
    }
    if (attribute->num_components() > 3) {
      out << "property " << GetAttributeDataType(color_att_id) << " alpha"
          << std::endl;
    }
  }
  if (in_mesh_) {
    out << "element face " << in_mesh_->num_faces() << std::endl;
    out << "property list uchar int vertex_indices" << std::endl;
    if (tex_coord_att_id >= 0) {
      // Texture coordinates are usually encoded in the property list (one value
      // per corner).
      out << "property list uchar " << GetAttributeDataType(tex_coord_att_id)
          << " texcoord" << std::endl;
    }
  }
  out << "end_header" << std::endl;

  // Not very efficient but the header should be small so just copy the stream
  // to a string.
  const std::string header_str = out.str();
  buffer()->Encode(header_str.data(), header_str.length());

  // Store point attributes.
  const int num_points = in_point_cloud_->num_points();
  for (PointIndex v(0); v < num_points; ++v) {
    const auto *const pos_att = in_point_cloud_->attribute(pos_att_id);
    buffer()->Encode(pos_att->GetAddress(pos_att->mapped_index(v)),
                     pos_att->byte_stride());
    if (normal_att_id >= 0) {
      const auto *const normal_att = in_point_cloud_->attribute(normal_att_id);
      buffer()->Encode(normal_att->GetAddress(normal_att->mapped_index(v)),
                       normal_att->byte_stride());
    }
    if (color_att_id >= 0) {
      const auto *const color_att = in_point_cloud_->attribute(color_att_id);
      buffer()->Encode(color_att->GetAddress(color_att->mapped_index(v)),
                       color_att->byte_stride());
    }
  }

  if (in_mesh_) {
    // Write face data.
    for (FaceIndex i(0); i < in_mesh_->num_faces(); ++i) {
      // Write the number of face indices (always 3).
      buffer()->Encode(static_cast<uint8_t>(3));

      const auto &f = in_mesh_->face(i);
      for (int c = 0; c < 3; ++c) {
        if (f[c] >= num_points) {
          // Invalid point stored on the |in_mesh_| face.
          return false;
        }
        buffer()->Encode(f[c]);
      }

      if (tex_coord_att_id >= 0) {
        // Two coordinates for every corner -> 6.
        buffer()->Encode(static_cast<uint8_t>(6));

        const auto *const tex_att =
            in_point_cloud_->attribute(tex_coord_att_id);
        for (int c = 0; c < 3; ++c) {
          buffer()->Encode(tex_att->GetAddress(tex_att->mapped_index(f[c])),
                           tex_att->byte_stride());
        }
      }
    }
  }
  return true;
}